

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall btLCP::pN_equals_ANC_times_qC(btLCP *this,btScalar *p,btScalar *q)

{
  int iVar1;
  uint uVar2;
  btScalar **ppbVar3;
  float *pfVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  btScalar bVar9;
  
  iVar1 = this->m_nN;
  if (0 < (long)iVar1) {
    uVar2 = this->m_nC;
    ppbVar3 = this->m_A;
    lVar7 = 0;
    do {
      pfVar8 = ppbVar3[(int)uVar2 + lVar7];
      bVar9 = 0.0;
      pfVar4 = q;
      uVar5 = uVar2;
      uVar6 = uVar2 - 2;
      if (1 < (int)uVar2) {
        do {
          bVar9 = (float)((ulong)*(undefined8 *)pfVar4 >> 0x20) *
                  (float)((ulong)*(undefined8 *)pfVar8 >> 0x20) +
                  bVar9 + (float)*(undefined8 *)pfVar4 * (float)*(undefined8 *)pfVar8;
          pfVar8 = pfVar8 + 2;
          pfVar4 = pfVar4 + 2;
          uVar5 = uVar5 - 2;
          uVar6 = (uVar2 - (uVar2 - 2 & 0xfffffffe)) - 4;
        } while (1 < uVar5);
      }
      if (uVar6 == 0xffffffff) {
        bVar9 = bVar9 + *pfVar8 * *pfVar4;
      }
      p[(int)uVar2 + lVar7] = bVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void btLCP::pN_equals_ANC_times_qC (btScalar *p, btScalar *q)
{
  // we could try to make this matrix-vector multiplication faster using
  // outer product matrix tricks, e.g. with the dMultidotX() functions.
  // but i tried it and it actually made things slower on random 100x100
  // problems because of the overhead involved. so we'll stick with the
  // simple method for now.
  const int nC = m_nC;
  btScalar *ptgt = p + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] = btLargeDot (BTAROW(i+nC),q,nC);
  }
}